

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall fixedMeasurement_doubleOps_Test::TestBody(fixedMeasurement_doubleOps_Test *this)

{
  internal iVar1;
  unit_data uVar2;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  fixed_measurement y;
  fixed_measurement f1;
  undefined1 local_78 [8];
  unit local_70;
  AssertHelper local_68;
  measurement local_60;
  undefined1 local_50 [8];
  unit local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  fixed_measurement local_30;
  
  local_30.value_ = (double)&DAT_f03f800000;
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::one + 4),(unit_data *)((long)&units::s + 4));
  local_78 = (undefined1  [8])((ulong)(uint)uVar2 << 0x20 | 0x3f800000);
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            ((internal *)local_50,"freq.units()","one / s",(unit *)&local_30,(unit *)local_78);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x168,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
    if ((long *)local_30.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.value_ + 8))();
    }
  }
  if (local_48 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_50,"static_cast<float>(freq2.value())","18.0",18.0,18.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x16a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
    if ((long *)local_30.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.value_ + 8))();
    }
  }
  if (local_48 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_50,"static_cast<float>(f4.value())","27.0",27.0,27.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x16f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
    if ((long *)local_30.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.value_ + 8))();
    }
  }
  if (local_48 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_50,"static_cast<float>(f3.value())","3.0",3.0,3.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x172,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
    if ((long *)local_30.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.value_ + 8))();
    }
  }
  if (local_48 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  local_50 = (undefined1  [8])&DAT_f03f800000;
  uVar2 = units::detail::unit_data::inv((unit_data *)(local_50 + 4));
  local_30.units_ = (unit)((ulong)(uint)uVar2 << 0x20 | 0x3f800000);
  local_30.value_ = 1.0;
  local_50 = (undefined1  [8])&DAT_3ff0000000000000;
  local_48 = (unit)&DAT_103f800000;
  iVar1 = (internal)units::fixed_measurement::operator==(&local_30,(measurement *)local_50);
  local_70.multiplier_ = 0.0;
  local_70.base_units_ = (unit_data)0x0;
  local_78[0] = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_78,(AssertionResult *)"f1 == (1.0 * s)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x175,(char *)local_50);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_50 != (undefined1  [8])&local_40) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    if ((long *)local_60.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_60.value_ + 8))();
    }
    if (local_70 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_78 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    }
  }
  local_50 = (undefined1  [8])&DAT_3ff0000000000000;
  local_48 = (unit)&DAT_103f800000;
  local_60.value_ = local_30.value_;
  local_60.units_ = local_30.units_;
  local_78[0] = (internal)units::measurement::operator==((measurement *)local_50,&local_60);
  local_70.multiplier_ = 0.0;
  local_70.base_units_ = (unit_data)0x0;
  if (!(bool)local_78[0]) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_78,(AssertionResult *)"(1.0 * s) == f1","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x176,(char *)local_50);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_50 != (undefined1  [8])&local_40) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    if ((long *)local_60.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_60.value_ + 8))();
    }
    if (local_70 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_78 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    }
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_50,"static_cast<float>(fp1.value())","12.0",12.0,12.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_48 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x179,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((unit)local_78 != (unit)0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if (local_48 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_50,"static_cast<float>(fp2.value())","12.0",12.0,12.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_48 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x17c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((unit)local_78 != (unit)0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if (local_48 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_50,"static_cast<float>(fp3.value())","6.0",6.0,6.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_48 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x17f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((unit)local_78 != (unit)0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if (local_48 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_50,"static_cast<float>(fp4.value())","3.0",3.0,3.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_48 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x182,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((unit)local_78 != (unit)0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if (local_48 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  local_50 = (undefined1  [8])&DAT_4000000000000000;
  local_48 = (unit)&DAT_13f800000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_78,"y.value()","2.0",2.0,2.0);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_70 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x185,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_60.value_ + 8))();
    }
  }
  if (local_70 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  }
  local_78._0_4_ = 0.0;
  local_78._4_4_ = (unit_data)0x40140000;
  local_70 = (unit)&DAT_13f800000;
  units::fixed_measurement::operator=((fixed_measurement *)local_50,(measurement *)local_78);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_78,"y.value()","5.0",(double)local_50,5.0);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_70 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x187,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_60.value_ + 8))();
    }
  }
  if (local_70 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  }
  local_50 = (undefined1  [8])&DAT_401c000000000000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_78,"y.value()","7.0",7.0,7.0);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_70 == (unit)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x189,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_60.value_ + 8))();
    }
  }
  if (local_70 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  }
  return;
}

Assistant:

TEST(fixedMeasurement, doubleOps)
{
    fixed_measurement freq(9.0, Hz);
    EXPECT_EQ(freq.units(), one / s);
    auto freq2 = 2.0 * freq;
    EXPECT_FLOAT_EQ(static_cast<float>(freq2.value()), 18.0);
    bool res = std::is_same<decltype(freq), decltype(freq2)>::value;
    EXPECT_TRUE(res);

    auto f4 = freq * 3;
    EXPECT_FLOAT_EQ(static_cast<float>(f4.value()), 27.0);

    auto f3 = freq / 3;
    EXPECT_FLOAT_EQ(static_cast<float>(f3.value()), 3.0);

    auto f1 = 9.0 / freq;
    EXPECT_TRUE(f1 == (1.0 * s));
    EXPECT_TRUE((1.0 * s) == f1);

    auto fp1 = freq + 3.0;
    EXPECT_FLOAT_EQ(static_cast<float>(fp1.value()), 12.0);

    auto fp2 = 3.0 + freq;
    EXPECT_FLOAT_EQ(static_cast<float>(fp2.value()), 12.0);

    auto fp3 = freq - 3.0;
    EXPECT_FLOAT_EQ(static_cast<float>(fp3.value()), 6.0);

    auto fp4 = 12.0 - freq;
    EXPECT_FLOAT_EQ(static_cast<float>(fp4.value()), 3.0);

    fixed_measurement y(2.0 * m);
    EXPECT_DOUBLE_EQ(y.value(), 2.0);
    y = 5.0 * m;
    EXPECT_DOUBLE_EQ(y.value(), 5.0);
    y = 7.0;
    EXPECT_DOUBLE_EQ(y.value(), 7.0);
}